

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SplitLargeMeshes.cpp
# Opt level: O0

void __thiscall
Assimp::SplitLargeMeshesProcess_Triangle::SplitMesh
          (SplitLargeMeshesProcess_Triangle *this,uint a,aiMesh *pMesh,
          vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
          *avList)

{
  uint uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined4 uVar10;
  vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
  *pvVar11;
  bool bVar12;
  uint uVar13;
  Logger *this_00;
  aiMesh *this_01;
  ulong uVar14;
  ulong *puVar15;
  aiVector3D *paVar16;
  aiColor4D *paVar17;
  ulong uVar18;
  aiBone **ppaVar19;
  reference pvVar20;
  aiBone *this_02;
  size_type sVar21;
  aiVertexWeight *paVar22;
  aiFace *paVar23;
  undefined8 *puVar24;
  pointer ppVar25;
  ulong uVar26;
  aiVertexWeight *local_650;
  aiColor4t<float> *local_618;
  aiVector3t<float> *local_5f0;
  aiVector3t<float> *local_5c8;
  aiVector3t<float> *local_5a0;
  aiVector3t<float> *local_578;
  aiVector3t<float> *local_550;
  aiFace *local_528;
  pair<aiMesh_*,_unsigned_int> local_500;
  pair<aiMesh_*,_unsigned_int> local_4f0;
  uint local_4dc;
  uint local_4d8;
  uint c_3;
  uint c_2;
  uint iIndexOut;
  uint iIndex;
  uint v;
  uint *piOut;
  uint *pi;
  uint local_4b0;
  uint iNumIndices;
  uint iTemp;
  uint p_2;
  uint iCurrent;
  aiBone *local_a0;
  aiBone *pc;
  aiVertexWeight *weight;
  uint q;
  aiBone *local_80;
  aiBone *bone;
  undefined1 local_70 [4];
  uint p_1;
  vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> avTempWeights;
  uint local_50;
  uint c_1;
  uint c;
  uint p;
  uint iCnt;
  uint iBase;
  aiMesh *pcMesh;
  uint i;
  uint iOutVertexNum;
  uint iOutFaceNum;
  uint iSubMeshes;
  vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
  *avList_local;
  aiMesh *pMesh_local;
  SplitLargeMeshesProcess_Triangle *pSStack_10;
  uint a_local;
  SplitLargeMeshesProcess_Triangle *this_local;
  
  _iOutFaceNum = avList;
  avList_local = (vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                  *)pMesh;
  pMesh_local._4_4_ = a;
  pSStack_10 = this;
  if (this->LIMIT < pMesh->mNumFaces) {
    this_00 = DefaultLogger::get();
    Logger::info(this_00,"Mesh exceeds the triangle limit. It will be split ...");
    iOutVertexNum =
         *(uint *)&(avList_local->
                   super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish / this->LIMIT + 1;
    i = *(uint *)&(avList_local->
                  super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish / iOutVertexNum;
    pcMesh._4_4_ = i * 3;
    for (pcMesh._0_4_ = 0; pvVar11 = avList_local, (uint)pcMesh < iOutVertexNum;
        pcMesh._0_4_ = (uint)pcMesh + 1) {
      this_01 = (aiMesh *)operator_new(0x520);
      aiMesh::aiMesh(this_01);
      this_01->mNumFaces = i;
      this_01->mMaterialIndex =
           *(uint *)&avList_local[9].
                     super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      _iCnt = this_01;
      aiString::operator=(&this_01->mName,
                          (aiString *)
                          ((long)&avList_local[9].
                                  super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      if ((uint)pcMesh == iOutVertexNum - 1) {
        _iCnt->mNumFaces =
             i + (*(int *)&(avList_local->
                           super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - i * iOutVertexNum);
      }
      uVar18 = CONCAT44(0,_iCnt->mNumFaces);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar18;
      uVar14 = SUB168(auVar3 * ZEXT816(0x10),0);
      uVar26 = uVar14 + 8;
      if (SUB168(auVar3 * ZEXT816(0x10),8) != 0 || 0xfffffffffffffff7 < uVar14) {
        uVar26 = 0xffffffffffffffff;
      }
      puVar15 = (ulong *)operator_new__(uVar26);
      *puVar15 = uVar18;
      paVar23 = (aiFace *)(puVar15 + 1);
      if (uVar18 != 0) {
        local_528 = paVar23;
        do {
          aiFace::aiFace(local_528);
          local_528 = local_528 + 1;
        } while (local_528 != paVar23 + uVar18);
      }
      _iCnt->mFaces = paVar23;
      c = 0;
      uVar13 = i * (uint)pcMesh;
      for (c_1 = uVar13; c_1 < _iCnt->mNumFaces + uVar13; c_1 = c_1 + 1) {
        c = *(int *)&avList_local[8].
                     super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage[c_1].first + c;
      }
      _iCnt->mNumVertices = c;
      if ((avList_local->
          super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        uVar18 = CONCAT44(0,c);
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar18;
        uVar14 = SUB168(auVar4 * ZEXT816(0xc),0);
        if (SUB168(auVar4 * ZEXT816(0xc),8) != 0) {
          uVar14 = 0xffffffffffffffff;
        }
        paVar16 = (aiVector3D *)operator_new__(uVar14);
        if (uVar18 != 0) {
          local_550 = paVar16;
          do {
            aiVector3t<float>::aiVector3t(local_550);
            local_550 = local_550 + 1;
          } while (local_550 != paVar16 + uVar18);
        }
        _iCnt->mVertices = paVar16;
      }
      bVar12 = aiMesh::HasNormals((aiMesh *)avList_local);
      if (bVar12) {
        uVar18 = CONCAT44(0,c);
        auVar5._8_8_ = 0;
        auVar5._0_8_ = uVar18;
        uVar14 = SUB168(auVar5 * ZEXT816(0xc),0);
        if (SUB168(auVar5 * ZEXT816(0xc),8) != 0) {
          uVar14 = 0xffffffffffffffff;
        }
        paVar16 = (aiVector3D *)operator_new__(uVar14);
        if (uVar18 != 0) {
          local_578 = paVar16;
          do {
            aiVector3t<float>::aiVector3t(local_578);
            local_578 = local_578 + 1;
          } while (local_578 != paVar16 + uVar18);
        }
        _iCnt->mNormals = paVar16;
      }
      bVar12 = aiMesh::HasTangentsAndBitangents((aiMesh *)avList_local);
      if (bVar12) {
        uVar18 = CONCAT44(0,c);
        auVar6._8_8_ = 0;
        auVar6._0_8_ = uVar18;
        uVar14 = SUB168(auVar6 * ZEXT816(0xc),0);
        if (SUB168(auVar6 * ZEXT816(0xc),8) != 0) {
          uVar14 = 0xffffffffffffffff;
        }
        paVar16 = (aiVector3D *)operator_new__(uVar14);
        if (uVar18 != 0) {
          local_5a0 = paVar16;
          do {
            aiVector3t<float>::aiVector3t(local_5a0);
            local_5a0 = local_5a0 + 1;
          } while (local_5a0 != paVar16 + uVar18);
        }
        _iCnt->mTangents = paVar16;
        uVar18 = CONCAT44(0,c);
        auVar7._8_8_ = 0;
        auVar7._0_8_ = uVar18;
        uVar14 = SUB168(auVar7 * ZEXT816(0xc),0);
        if (SUB168(auVar7 * ZEXT816(0xc),8) != 0) {
          uVar14 = 0xffffffffffffffff;
        }
        paVar16 = (aiVector3D *)operator_new__(uVar14);
        if (uVar18 != 0) {
          local_5c8 = paVar16;
          do {
            aiVector3t<float>::aiVector3t(local_5c8);
            local_5c8 = local_5c8 + 1;
          } while (local_5c8 != paVar16 + uVar18);
        }
        _iCnt->mBitangents = paVar16;
      }
      for (local_50 = 0; local_50 < 8; local_50 = local_50 + 1) {
        _iCnt->mNumUVComponents[local_50] =
             *(uint *)((long)&avList_local[7].
                              super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish + (ulong)local_50 * 4);
        bVar12 = aiMesh::HasTextureCoords((aiMesh *)avList_local,local_50);
        if (bVar12) {
          uVar18 = CONCAT44(0,c);
          auVar8._8_8_ = 0;
          auVar8._0_8_ = uVar18;
          uVar14 = SUB168(auVar8 * ZEXT816(0xc),0);
          if (SUB168(auVar8 * ZEXT816(0xc),8) != 0) {
            uVar14 = 0xffffffffffffffff;
          }
          paVar16 = (aiVector3D *)operator_new__(uVar14);
          if (uVar18 != 0) {
            local_5f0 = paVar16;
            do {
              aiVector3t<float>::aiVector3t(local_5f0);
              local_5f0 = local_5f0 + 1;
            } while (local_5f0 != paVar16 + uVar18);
          }
          _iCnt->mTextureCoords[local_50] = paVar16;
        }
      }
      for (avTempWeights.super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          avTempWeights.super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ < 8;
          avTempWeights.super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ =
               avTempWeights.super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
        bVar12 = aiMesh::HasVertexColors
                           ((aiMesh *)avList_local,
                            avTempWeights.
                            super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        if (bVar12) {
          uVar18 = CONCAT44(0,c);
          auVar9._8_8_ = 0;
          auVar9._0_8_ = uVar18;
          uVar14 = SUB168(auVar9 * ZEXT816(0x10),0);
          if (SUB168(auVar9 * ZEXT816(0x10),8) != 0) {
            uVar14 = 0xffffffffffffffff;
          }
          paVar17 = (aiColor4D *)operator_new__(uVar14);
          if (uVar18 != 0) {
            local_618 = paVar17;
            do {
              aiColor4t<float>::aiColor4t(local_618);
              local_618 = local_618 + 1;
            } while (local_618 != paVar17 + uVar18);
          }
          _iCnt->mColors
          [avTempWeights.super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage._4_4_] = paVar17;
        }
      }
      bVar12 = aiMesh::HasBones((aiMesh *)avList_local);
      if (bVar12) {
        auVar3 = ZEXT416(*(uint *)&avList_local[9].
                                   super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) * ZEXT816(8);
        uVar18 = auVar3._0_8_;
        if (auVar3._8_8_ != 0) {
          uVar18 = 0xffffffffffffffff;
        }
        ppaVar19 = (aiBone **)operator_new__(uVar18);
        _iCnt->mBones = ppaVar19;
        std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::vector
                  ((vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)local_70);
        for (bone._4_4_ = 0; bone._4_4_ < _iCnt->mNumBones; bone._4_4_ = bone._4_4_ + 1) {
          local_80 = _iCnt->mBones[bone._4_4_];
          std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::clear
                    ((vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)local_70);
          std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::reserve
                    ((vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)local_70,
                     (ulong)local_80->mNumWeights / (ulong)iOutVertexNum);
          for (weight._0_4_ = 0; (uint)weight < local_80->mNumWeights;
              weight._0_4_ = (uint)weight + 1) {
            pc = (aiBone *)(local_80->mWeights + (uint)weight);
            if ((uVar13 <= (pc->mName).length) && ((pc->mName).length < uVar13 + pcMesh._4_4_)) {
              std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::push_back
                        ((vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)local_70,
                         (value_type *)pc);
              pvVar20 = std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::back
                                  ((vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)
                                   local_70);
              *(value_type *)&pc->mName = *pvVar20;
              (pc->mName).length = (pc->mName).length - uVar13;
            }
          }
          bVar12 = std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::empty
                             ((vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)local_70);
          if (!bVar12) {
            this_02 = (aiBone *)operator_new(0x460);
            aiBone::aiBone(this_02);
            uVar1 = _iCnt->mNumBones;
            _iCnt->mNumBones = uVar1 + 1;
            _iCnt->mBones[uVar1] = this_02;
            local_a0 = this_02;
            aiString::aiString((aiString *)&p_2,&local_80->mName);
            aiString::operator=(&local_a0->mName,(aiString *)&p_2);
            sVar21 = std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::size
                               ((vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)local_70)
            ;
            local_a0->mNumWeights = (uint)sVar21;
            memcpy(&local_a0->mOffsetMatrix,&local_80->mOffsetMatrix,0x40);
            if (iOutVertexNum - 1 == (uint)pcMesh) {
              local_a0->mWeights = local_80->mWeights;
              local_80->mWeights = (aiVertexWeight *)0x0;
            }
            else {
              uVar18 = (ulong)local_a0->mNumWeights;
              paVar22 = (aiVertexWeight *)operator_new__(uVar18 << 3);
              if (uVar18 != 0) {
                local_650 = paVar22;
                do {
                  aiVertexWeight::aiVertexWeight(local_650);
                  local_650 = local_650 + 1;
                } while (local_650 != paVar22 + uVar18);
              }
              local_a0->mWeights = paVar22;
            }
            paVar22 = local_a0->mWeights;
            pvVar20 = std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::operator[]
                                ((vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)local_70
                                 ,0);
            memcpy(paVar22,pvVar20,(ulong)local_a0->mNumWeights << 3);
          }
        }
        std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::~vector
                  ((vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)local_70);
      }
      iTemp = 0;
      for (iNumIndices = 0; pvVar11 = _iOutFaceNum, iNumIndices < _iCnt->mNumFaces;
          iNumIndices = iNumIndices + 1) {
        _iCnt->mFaces[iNumIndices].mNumIndices = 3;
        local_4b0 = iNumIndices + uVar13;
        pi._4_4_ = *(uint *)&avList_local[8].
                             super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage[local_4b0].first;
        _iCnt->mFaces[iNumIndices].mNumIndices = pi._4_4_;
        piOut = *(uint **)&avList_local[8].
                           super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage[local_4b0].second;
        _iIndex = (uint *)operator_new__((ulong)pi._4_4_ << 2);
        _iCnt->mFaces[iNumIndices].mIndices = _iIndex;
        if (pi._4_4_ == 1) {
          _iCnt->mPrimitiveTypes = _iCnt->mPrimitiveTypes | 1;
        }
        else if (pi._4_4_ == 2) {
          _iCnt->mPrimitiveTypes = _iCnt->mPrimitiveTypes | 2;
        }
        else if (pi._4_4_ == 3) {
          _iCnt->mPrimitiveTypes = _iCnt->mPrimitiveTypes | 4;
        }
        else {
          _iCnt->mPrimitiveTypes = _iCnt->mPrimitiveTypes | 8;
        }
        for (iIndexOut = 0; iIndexOut < pi._4_4_; iIndexOut = iIndexOut + 1) {
          c_2 = piOut[iIndexOut];
          c_3 = iTemp;
          _iIndex[iIndexOut] = iTemp;
          if ((avList_local->
              super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
            puVar24 = (undefined8 *)
                      ((long)&((avList_local->
                               super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                               )._M_impl.super__Vector_impl_data._M_end_of_storage)->first +
                      (ulong)c_2 * 0xc);
            paVar16 = _iCnt->mVertices + iTemp;
            uVar2 = *puVar24;
            paVar16->x = (float)(int)uVar2;
            paVar16->y = (float)(int)((ulong)uVar2 >> 0x20);
            paVar16->z = *(float *)(puVar24 + 1);
          }
          iTemp = iTemp + 1;
          bVar12 = aiMesh::HasNormals((aiMesh *)avList_local);
          if (bVar12) {
            puVar24 = (undefined8 *)
                      ((long)&(avList_local[1].
                               super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->first + (ulong)c_2 * 0xc)
            ;
            paVar16 = _iCnt->mNormals + c_3;
            uVar2 = *puVar24;
            paVar16->x = (float)(int)uVar2;
            paVar16->y = (float)(int)((ulong)uVar2 >> 0x20);
            paVar16->z = *(float *)(puVar24 + 1);
          }
          bVar12 = aiMesh::HasTangentsAndBitangents((aiMesh *)avList_local);
          if (bVar12) {
            puVar24 = (undefined8 *)
                      ((long)&(avList_local[1].
                               super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish)->first + (ulong)c_2 * 0xc
                      );
            paVar16 = _iCnt->mTangents + c_3;
            uVar2 = *puVar24;
            paVar16->x = (float)(int)uVar2;
            paVar16->y = (float)(int)((ulong)uVar2 >> 0x20);
            paVar16->z = *(float *)(puVar24 + 1);
            puVar24 = (undefined8 *)
                      ((long)&(avList_local[1].
                               super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage)->first +
                      (ulong)c_2 * 0xc);
            paVar16 = _iCnt->mBitangents + c_3;
            uVar2 = *puVar24;
            paVar16->x = (float)(int)uVar2;
            paVar16->y = (float)(int)((ulong)uVar2 >> 0x20);
            paVar16->z = *(float *)(puVar24 + 1);
          }
          for (local_4d8 = 0; local_4d8 < 8; local_4d8 = local_4d8 + 1) {
            bVar12 = aiMesh::HasTextureCoords((aiMesh *)avList_local,local_4d8);
            if (bVar12) {
              puVar24 = (undefined8 *)
                        ((long)&(&avList_local[4].
                                  super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage)[local_4d8]->
                                first + (ulong)c_2 * 0xc);
              paVar16 = _iCnt->mTextureCoords[local_4d8] + c_3;
              uVar2 = *puVar24;
              paVar16->x = (float)(int)uVar2;
              paVar16->y = (float)(int)((ulong)uVar2 >> 0x20);
              paVar16->z = *(float *)(puVar24 + 1);
            }
          }
          for (local_4dc = 0; local_4dc < 8; local_4dc = local_4dc + 1) {
            bVar12 = aiMesh::HasVertexColors((aiMesh *)avList_local,local_4dc);
            if (bVar12) {
              ppVar25 = (&avList_local[2].
                          super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)[local_4dc] + c_2;
              paVar17 = _iCnt->mColors[local_4dc] + c_3;
              *(aiMesh **)paVar17 = ppVar25->first;
              uVar10 = *(undefined4 *)&ppVar25->field_0xc;
              paVar17->b = (float)ppVar25->second;
              paVar17->a = (float)uVar10;
            }
          }
        }
      }
      std::pair<aiMesh_*,_unsigned_int>::pair<aiMesh_*&,_unsigned_int_&,_true>
                (&local_4f0,(aiMesh **)&iCnt,(uint *)((long)&pMesh_local + 4));
      std::
      vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
      ::push_back(pvVar11,&local_4f0);
    }
    if (avList_local !=
        (vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
         *)0x0) {
      aiMesh::~aiMesh((aiMesh *)avList_local);
      operator_delete(pvVar11,0x520);
    }
  }
  else {
    std::pair<aiMesh_*,_unsigned_int>::pair<aiMesh_*&,_unsigned_int_&,_true>
              (&local_500,(aiMesh **)&avList_local,(uint *)((long)&pMesh_local + 4));
    std::
    vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>::
    push_back(avList,&local_500);
  }
  return;
}

Assistant:

void SplitLargeMeshesProcess_Triangle::SplitMesh(
        unsigned int a,
        aiMesh* pMesh,
        std::vector<std::pair<aiMesh*, unsigned int> >& avList) {
    if (pMesh->mNumFaces > SplitLargeMeshesProcess_Triangle::LIMIT) {
        ASSIMP_LOG_INFO("Mesh exceeds the triangle limit. It will be split ...");

        // we need to split this mesh into sub meshes
        // determine the size of a submesh
        const unsigned int iSubMeshes = (pMesh->mNumFaces / LIMIT) + 1;

        const unsigned int iOutFaceNum = pMesh->mNumFaces / iSubMeshes;
        const unsigned int iOutVertexNum = iOutFaceNum * 3;

        // now generate all submeshes
        for (unsigned int i = 0; i < iSubMeshes;++i) {
            aiMesh* pcMesh          = new aiMesh;
            pcMesh->mNumFaces       = iOutFaceNum;
            pcMesh->mMaterialIndex  = pMesh->mMaterialIndex;

            // the name carries the adjacency information between the meshes
            pcMesh->mName = pMesh->mName;

            if (i == iSubMeshes-1) {
                pcMesh->mNumFaces = iOutFaceNum + (
                    pMesh->mNumFaces - iOutFaceNum * iSubMeshes);
            }
            // copy the list of faces
            pcMesh->mFaces = new aiFace[pcMesh->mNumFaces];

            const unsigned int iBase = iOutFaceNum * i;

            // get the total number of indices
            unsigned int iCnt = 0;
            for (unsigned int p = iBase; p < pcMesh->mNumFaces + iBase;++p) {
                iCnt += pMesh->mFaces[p].mNumIndices;
            }
            pcMesh->mNumVertices = iCnt;

            // allocate storage
            if (pMesh->mVertices != nullptr) {
                pcMesh->mVertices = new aiVector3D[iCnt];
            }

            if (pMesh->HasNormals()) {
                pcMesh->mNormals = new aiVector3D[iCnt];
            }

            if (pMesh->HasTangentsAndBitangents()) {
                pcMesh->mTangents = new aiVector3D[iCnt];
                pcMesh->mBitangents = new aiVector3D[iCnt];
            }

            // texture coordinates
            for (unsigned int c = 0;  c < AI_MAX_NUMBER_OF_TEXTURECOORDS;++c) {
                pcMesh->mNumUVComponents[c] = pMesh->mNumUVComponents[c];
                if (pMesh->HasTextureCoords( c)) {
                    pcMesh->mTextureCoords[c] = new aiVector3D[iCnt];
                }
            }

            // vertex colors
            for (unsigned int c = 0;  c < AI_MAX_NUMBER_OF_COLOR_SETS;++c) {
                if (pMesh->HasVertexColors( c)) {
                    pcMesh->mColors[c] = new aiColor4D[iCnt];
                }
            }

            if (pMesh->HasBones()) {
                // assume the number of bones won't change in most cases
                pcMesh->mBones = new aiBone*[pMesh->mNumBones];

                // iterate through all bones of the mesh and find those which
                // need to be copied to the split mesh
                std::vector<aiVertexWeight> avTempWeights;
                for (unsigned int p = 0; p < pcMesh->mNumBones;++p) {
                    aiBone* const bone = pcMesh->mBones[p];
                    avTempWeights.clear();
                    avTempWeights.reserve(bone->mNumWeights / iSubMeshes);

                    for (unsigned int q = 0; q < bone->mNumWeights;++q) {
                        aiVertexWeight& weight = bone->mWeights[q];
                        if(weight.mVertexId >= iBase && weight.mVertexId < iBase + iOutVertexNum) {
                            avTempWeights.push_back(weight);
                            weight = avTempWeights.back();
                            weight.mVertexId -= iBase;
                        }
                    }

                    if (!avTempWeights.empty()) {
                        // we'll need this bone. Copy it ...
                        aiBone* pc = new aiBone();
                        pcMesh->mBones[pcMesh->mNumBones++] = pc;
                        pc->mName = aiString(bone->mName);
                        pc->mNumWeights = (unsigned int)avTempWeights.size();
                        pc->mOffsetMatrix = bone->mOffsetMatrix;

                        // no need to reallocate the array for the last submesh.
                        // Here we can reuse the (large) source array, although
                        // we'll waste some memory
                        if (iSubMeshes-1 == i) {
                            pc->mWeights = bone->mWeights;
                            bone->mWeights = nullptr;
                        } else {
                            pc->mWeights = new aiVertexWeight[pc->mNumWeights];
                        }

                        // copy the weights
                        ::memcpy(pc->mWeights,&avTempWeights[0],sizeof(aiVertexWeight)*pc->mNumWeights);
                    }
                }
            }

            // (we will also need to copy the array of indices)
            unsigned int iCurrent = 0;
            for (unsigned int p = 0; p < pcMesh->mNumFaces;++p) {
                pcMesh->mFaces[p].mNumIndices = 3;
                // allocate a new array
                const unsigned int iTemp = p + iBase;
                const unsigned int iNumIndices = pMesh->mFaces[iTemp].mNumIndices;

                // setup face type and number of indices
                pcMesh->mFaces[p].mNumIndices = iNumIndices;
                unsigned int* pi = pMesh->mFaces[iTemp].mIndices;
                unsigned int* piOut = pcMesh->mFaces[p].mIndices = new unsigned int[iNumIndices];

                // need to update the output primitive types
                switch (iNumIndices) {
                case 1:
                    pcMesh->mPrimitiveTypes |= aiPrimitiveType_POINT;
                    break;
                case 2:
                    pcMesh->mPrimitiveTypes |= aiPrimitiveType_LINE;
                    break;
                case 3:
                    pcMesh->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
                    break;
                default:
                    pcMesh->mPrimitiveTypes |= aiPrimitiveType_POLYGON;
                }

                // and copy the contents of the old array, offset by current base
                for (unsigned int v = 0; v < iNumIndices;++v) {
                    unsigned int iIndex = pi[v];
                    unsigned int iIndexOut = iCurrent++;
                    piOut[v] = iIndexOut;

                    // copy positions
                    if (pMesh->mVertices != nullptr) {
                        pcMesh->mVertices[iIndexOut] = pMesh->mVertices[iIndex];
                    }

                    // copy normals
                    if (pMesh->HasNormals()) {
                        pcMesh->mNormals[iIndexOut] = pMesh->mNormals[iIndex];
                    }

                    // copy tangents/bitangents
                    if (pMesh->HasTangentsAndBitangents()) {
                        pcMesh->mTangents[iIndexOut] = pMesh->mTangents[iIndex];
                        pcMesh->mBitangents[iIndexOut] = pMesh->mBitangents[iIndex];
                    }

                    // texture coordinates
                    for (unsigned int c = 0;  c < AI_MAX_NUMBER_OF_TEXTURECOORDS;++c) {
                        if (pMesh->HasTextureCoords( c ) ) {
                            pcMesh->mTextureCoords[c][iIndexOut] = pMesh->mTextureCoords[c][iIndex];
                        }
                    }
                    // vertex colors
                    for (unsigned int c = 0;  c < AI_MAX_NUMBER_OF_COLOR_SETS;++c) {
                        if (pMesh->HasVertexColors( c)) {
                            pcMesh->mColors[c][iIndexOut] = pMesh->mColors[c][iIndex];
                        }
                    }
                }
            }

            // add the newly created mesh to the list
            avList.push_back(std::pair<aiMesh*, unsigned int>(pcMesh,a));
        }

        // now delete the old mesh data
        delete pMesh;
    } else {
        avList.push_back(std::pair<aiMesh*, unsigned int>(pMesh,a));
    }
}